

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int lys_check_xpath(lys_node *node,int check_place,int warn_on_fwd_ref)

{
  uint16_t flags1;
  uint16_t flags2;
  char *name1;
  int iVar1;
  lys_module *mod1;
  lys_module *mod2;
  bool bVar2;
  uint local_6c;
  int ret;
  uint32_t i;
  lyxp_set set;
  lys_node *local_30;
  lys_node *elem;
  lys_node *parent;
  int warn_on_fwd_ref_local;
  int check_place_local;
  lys_node *node_local;
  
  elem = node;
  if (check_place != 0) {
    while (elem != (lys_node *)0x0) {
      if (elem->nodetype == LYS_GROUPING) {
        return 0;
      }
      if (elem->nodetype == LYS_AUGMENT) {
        if (elem->prev == (lys_node *)0x0) {
          if ((char)elem->module->field_0x40 < '\0') {
            return 1;
          }
          return 0;
        }
        elem = elem->prev;
      }
      else {
        elem = elem->parent;
      }
    }
  }
  node_local._4_4_ = lyxp_node_atomize(node,(lyxp_set *)&ret,warn_on_fwd_ref);
  elem = node;
  if (node_local._4_4_ == -1) {
    node_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (elem != (lys_node *)0x0) {
        bVar2 = (elem->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar2) break;
      elem = lys_parent(elem);
    }
    for (local_6c = 0; local_6c < (uint)set.val._8_4_; local_6c = local_6c + 1) {
      if (*(int *)(set._8_8_ + (ulong)local_6c * 0x10 + 8) == 2) {
        flags1 = node->flags;
        mod1 = lys_node_module(node);
        name1 = node->name;
        flags2 = *(uint16_t *)(*(long *)(set._8_8_ + (ulong)local_6c * 0x10) + 0x18);
        mod2 = lys_node_module(*(lys_node **)(set._8_8_ + (ulong)local_6c * 0x10));
        iVar1 = lyp_check_status(flags1,mod1,name1,flags2,mod2,
                                 (char *)**(undefined8 **)(set._8_8_ + (ulong)local_6c * 0x10),node)
        ;
        if (iVar1 != 0) {
          return -1;
        }
        if (elem != (lys_node *)0x0) {
          for (local_30 = *(lys_node **)(set._8_8_ + (ulong)local_6c * 0x10);
              local_30 != (lys_node *)0x0 && local_30 != elem; local_30 = lys_parent(local_30)) {
          }
          if (local_30 == (lys_node *)0x0) {
            node->flags = node->flags | 0x200;
            break;
          }
        }
      }
    }
    free((void *)set._8_8_);
  }
  return node_local._4_4_;
}

Assistant:

int
lys_check_xpath(struct lys_node *node, int check_place, int warn_on_fwd_ref)
{
    struct lys_node *parent, *elem;
    struct lyxp_set set;
    uint32_t i;
    int ret;

    if (check_place) {
        parent = node;
        while (parent) {
            if (parent->nodetype == LYS_GROUPING) {
                /* unresolved grouping, skip for now (will be checked later) */
                return EXIT_SUCCESS;
            }
            if (parent->nodetype == LYS_AUGMENT) {
                if (!((struct lys_node_augment *)parent)->target) {
                    /* unresolved augment */
                    if (parent->module->implemented) {
                        /* skip for now (will be checked later) */
                        return EXIT_FAILURE;
                    } else {
                        /* not implemented augment, skip resolving */
                        return EXIT_SUCCESS;
                    }
                } else {
                    parent = ((struct lys_node_augment *)parent)->target;
                    continue;
                }
            }
            parent = parent->parent;
        }
    }

    ret = lyxp_node_atomize(node, &set, warn_on_fwd_ref);
    if (ret == -1) {
        return -1;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)); parent = lys_parent(parent));

    for (i = 0; i < set.used; ++i) {
        /* skip roots'n'stuff */
        if (set.val.snodes[i].type == LYXP_NODE_ELEM) {
            /* XPath expression cannot reference "lower" status than the node that has the definition */
            if (lyp_check_status(node->flags, lys_node_module(node), node->name, set.val.snodes[i].snode->flags,
                    lys_node_module(set.val.snodes[i].snode), set.val.snodes[i].snode->name, node)) {
                return -1;
            }

            if (parent) {
                for (elem = set.val.snodes[i].snode; elem && (elem != parent); elem = lys_parent(elem));
                if (!elem) {
                    /* not in node's RPC or notification subtree, set the flag */
                    node->flags |= LYS_XPATH_DEP;
                    break;
                }
            }
        }
    }

    free(set.val.snodes);
    return ret;
}